

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

size_t __thiscall
obx::Box<objectbox::tsdemo::SensorValues>::
putMany<std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>>
          (Box<objectbox::tsdemo::SensorValues> *this,
          vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          *objects,vector<unsigned_long,_std::allocator<unsigned_long>_> *outIds,OBXPutMode mode)

{
  Store *store;
  bool bVar1;
  obx_schema_id entityId;
  size_type __n;
  FlatBufferBuilder *fbb_00;
  obx_id local_a0;
  obx_id id;
  SensorValues *object;
  iterator __end0;
  iterator __begin0;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  *__range3;
  FlatBufferBuilder *fbb;
  CursorTx cursor;
  size_t count;
  OBXPutMode mode_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *outIds_local;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  *objects_local;
  Box<objectbox::tsdemo::SensorValues> *this_local;
  
  if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(outIds);
    __n = std::
          vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          ::size(objects);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(outIds,__n);
  }
  bVar1 = std::
          vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          ::empty(objects);
  if (bVar1) {
    this_local = (Box<objectbox::tsdemo::SensorValues> *)0x0;
  }
  else {
    cursor.cCursor_ = (OBX_cursor *)0x0;
    store = (this->super_BoxTypeless).store_;
    entityId = objectbox::tsdemo::SensorValues::_OBX_MetaInfo::entityId();
    anon_unknown_3::CursorTx::CursorTx((CursorTx *)&fbb,WRITE,store,entityId);
    fbb_00 = internal::threadLocalFbbDirty();
    __end0 = std::
             vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
             ::begin(objects);
    object = (SensorValues *)
             std::
             vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
             ::end(objects);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<objectbox::tsdemo::SensorValues_*,_std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>_>
                                  *)&object);
      if (!bVar1) break;
      id = (obx_id)__gnu_cxx::
                   __normal_iterator<objectbox::tsdemo::SensorValues_*,_std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>_>
                   ::operator*(&__end0);
      local_a0 = cursorPut(this,(CursorTx *)&fbb,fbb_00,(SensorValues *)id,mode);
      if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(outIds,&local_a0);
      }
      if (local_a0 != 0) {
        cursor.cCursor_ = cursor.cCursor_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<objectbox::tsdemo::SensorValues_*,_std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>_>
      ::operator++(&__end0);
    }
    internal::threadLocalFbbDone();
    anon_unknown_3::CursorTx::commitAndClose((CursorTx *)&fbb);
    this_local = (Box<objectbox::tsdemo::SensorValues> *)cursor.cCursor_;
    anon_unknown_3::CursorTx::~CursorTx((CursorTx *)&fbb);
  }
  return (size_t)this_local;
}

Assistant:

size_t putMany(Vector& objects, std::vector<obx_id>* outIds, OBXPutMode mode) {
        if (outIds) {
            outIds->clear();
            outIds->reserve(objects.size());
        }

        // Don't start a TX in case there's no data.
        // Note: Don't move this above clearing outIds vector - our contract says that we clear outIds before starting
        // execution, so we must do it even if no objects were passed.
        if (objects.empty()) return 0;

        size_t count = 0;
        CursorTx cursor(TxMode::WRITE, store_, EntityBinding::entityId());
        flatbuffers::FlatBufferBuilder& fbb = internal::threadLocalFbbDirty();

        for (auto& object : objects) {
            obx_id id = cursorPut(cursor, fbb, object, mode);  // type-based overloads below
            if (outIds) outIds->push_back(id);  // always include in outIds even if the item wasn't present (id == 0)
            if (id) count++;
        }
        internal::threadLocalFbbDone();  // NOTE might not get called in case of an exception
        cursor.commitAndClose();
        return count;
    }